

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  parasail_result_t *ppVar10;
  __m128i *ptr;
  __m128i *palVar11;
  __m128i *ptr_00;
  int64_t *ptr_01;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong size;
  int iVar27;
  int iVar28;
  ulong uVar29;
  __m128i *ptr_02;
  undefined1 auVar30 [12];
  undefined4 uVar44;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i alVar43;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 uVar54;
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  __m128i_64_t A;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i_64_t B_2;
  long lVar60;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  long lVar61;
  __m128i_64_t B;
  undefined1 auVar62 [16];
  long lVar64;
  undefined1 auVar63 [16];
  long lVar65;
  __m128i_64_t B_3;
  long lVar67;
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  int64_t iVar45;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_nw_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse41_128_64_cold_4();
        }
        else {
          uVar17 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_striped_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_striped_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_striped_profile_sse41_128_64_cold_1();
          }
          else {
            uVar9 = uVar2 - 1;
            size = (ulong)uVar2 + 1 >> 1;
            uVar13 = (ulong)(uint)open;
            iVar21 = -open;
            iVar28 = ppVar4->min;
            uVar29 = 0x8000000000000000 - (long)iVar28;
            if (iVar28 != iVar21 && SBORROW4(iVar28,iVar21) == iVar28 + open < 0) {
              uVar29 = uVar13 | 0x8000000000000000;
            }
            iVar28 = ppVar4->max;
            ppVar10 = parasail_result_new_table1((uint)((ulong)uVar2 + 1) & 0x7ffffffe,s2Len);
            if (ppVar10 != (parasail_result_t *)0x0) {
              iVar27 = (int)(uVar9 / size);
              ppVar10->flag = ppVar10->flag | 0x2820801;
              ptr = parasail_memalign___m128i(0x10,size);
              palVar11 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
              if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (palVar11 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
                iVar12 = s2Len + -1;
                lVar14 = uVar29 + 1;
                lVar19 = 0x7ffffffffffffffe - (long)iVar28;
                uVar44 = (undefined4)((ulong)lVar14 >> 0x20);
                uVar54 = (undefined4)((ulong)lVar19 >> 0x20);
                auVar49._8_4_ = (int)lVar19;
                auVar49._0_8_ = lVar19;
                auVar49._12_4_ = uVar54;
                uVar15 = (ulong)(uint)gap;
                lVar18 = (long)iVar21;
                lVar16 = size << 4;
                lVar23 = 0;
                lVar25 = lVar18;
                do {
                  auVar46._8_8_ = -(size * uVar15) + lVar25;
                  auVar46._0_8_ = lVar25;
                  *(undefined1 (*) [16])((long)*ptr + lVar23) = auVar46;
                  plVar1 = (long *)((long)*ptr_00 + lVar23);
                  *plVar1 = lVar25 - uVar13;
                  plVar1[1] = (-(size * uVar15) - uVar13) + lVar25;
                  lVar25 = lVar25 - uVar15;
                  lVar23 = lVar23 + 0x10;
                } while (lVar16 != lVar23);
                *ptr_01 = 0;
                auVar56 = _DAT_00906ca0;
                lVar25 = uVar17 - 1;
                auVar31._8_4_ = (int)lVar25;
                auVar31._0_8_ = lVar25;
                auVar31._12_4_ = (int)((ulong)lVar25 >> 0x20);
                uVar20 = 0;
                auVar46 = pmovsxbq(auVar46,0x100);
                auVar31 = auVar31 ^ _DAT_00906ca0;
                do {
                  if ((bool)(~(auVar31._0_8_ < (long)(uVar20 ^ auVar56._0_8_)) & 1)) {
                    ptr_01[uVar20 + 1] = lVar18;
                  }
                  auVar62._8_4_ = (int)uVar20;
                  auVar62._0_8_ = uVar20;
                  auVar62._12_4_ = (int)(uVar20 >> 0x20);
                  if ((long)((auVar62._8_8_ | auVar46._8_8_) ^ auVar56._8_8_) <= auVar31._8_8_) {
                    ptr_01[uVar20 + 2] = lVar18 - uVar15;
                  }
                  uVar20 = uVar20 + 2;
                  lVar18 = lVar18 + uVar15 * -2;
                } while ((s2Len + 1U & 0xfffffffe) != uVar20);
                lVar18 = size * uVar17 * 4;
                lVar25 = 0;
                uVar15 = 0;
                auVar56._8_4_ = (int)lVar14;
                auVar56._0_8_ = lVar14;
                auVar56._12_4_ = uVar44;
                do {
                  ptr_02 = ptr;
                  ptr = palVar11;
                  palVar11 = ptr_02 + ((int)size - 1);
                  auVar47._8_4_ = (int)(*palVar11)[0];
                  auVar47._0_8_ = (*palVar11)[0];
                  auVar47._12_4_ = *(undefined4 *)((long)*palVar11 + 4);
                  iVar28 = ppVar4->mapper[(byte)s2[uVar15]];
                  iVar45 = ptr_01[uVar15];
                  lVar23 = auVar47._8_8_;
                  lVar26 = 0;
                  auVar58._8_4_ = (int)lVar14;
                  auVar58._0_8_ = lVar14;
                  auVar58._12_4_ = uVar44;
                  lVar24 = lVar25;
                  do {
                    plVar1 = (long *)((long)pvVar3 + lVar26 + (long)iVar28 * (long)(int)size * 0x10)
                    ;
                    auVar48._0_8_ = iVar45 + *plVar1;
                    auVar48._8_8_ = lVar23 + plVar1[1];
                    auVar46 = *(undefined1 (*) [16])((long)*ptr_00 + lVar26);
                    lVar61 = auVar46._0_8_;
                    auVar32._0_8_ = -(ulong)(lVar61 < auVar48._0_8_);
                    lVar64 = auVar46._8_8_;
                    auVar32._8_8_ = -(ulong)(lVar64 < auVar48._8_8_);
                    auVar31 = blendvpd(auVar46,auVar48,auVar32);
                    lVar23 = auVar58._0_8_;
                    auVar33._0_8_ = -(ulong)(lVar23 < auVar31._0_8_);
                    lVar60 = auVar58._8_8_;
                    auVar33._8_8_ = -(ulong)(lVar60 < auVar31._8_8_);
                    auVar31 = blendvpd(auVar58,auVar31,auVar33);
                    lVar65 = auVar31._0_8_;
                    auVar34._0_8_ = -(ulong)(lVar65 < auVar56._0_8_);
                    lVar67 = auVar31._8_8_;
                    auVar34._8_8_ = -(ulong)(lVar67 < auVar56._8_8_);
                    auVar56 = blendvpd(auVar31,auVar56,auVar34);
                    auVar35._0_8_ = -(ulong)(auVar49._0_8_ < lVar65);
                    auVar35._8_8_ = -(ulong)(auVar49._8_8_ < lVar67);
                    auVar49 = blendvpd(auVar31,auVar49,auVar35);
                    auVar36._0_8_ = -(ulong)(auVar49._0_8_ < lVar61);
                    auVar36._8_8_ = -(ulong)(auVar49._8_8_ < lVar64);
                    auVar49 = blendvpd(auVar46,auVar49,auVar36);
                    *(undefined1 (*) [16])((long)*ptr + lVar26) = auVar31;
                    auVar37._0_8_ = -(ulong)(auVar49._0_8_ < lVar23);
                    auVar37._8_8_ = -(ulong)(auVar49._8_8_ < lVar60);
                    auVar49 = blendvpd(auVar58,auVar49,auVar37);
                    piVar5 = ((ppVar10->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar24) = auVar31._0_4_;
                    *(int *)((long)piVar5 + lVar18 + lVar24) = auVar31._8_4_;
                    auVar66._0_8_ = lVar65 - uVar13;
                    auVar66._8_8_ = lVar67 - uVar13;
                    auVar63._0_8_ = lVar61 - (ulong)(uint)gap;
                    auVar63._8_8_ = lVar64 - (ulong)(uint)gap;
                    auVar38._0_8_ = -(ulong)(auVar66._0_8_ < auVar63._0_8_);
                    auVar38._8_8_ = -(ulong)(auVar66._8_8_ < auVar63._8_8_);
                    auVar68._0_8_ = lVar23 - (ulong)(uint)gap;
                    auVar68._8_8_ = lVar60 - (ulong)(uint)gap;
                    auVar50._0_8_ = -(ulong)(auVar66._0_8_ < auVar68._0_8_);
                    auVar50._8_8_ = -(ulong)(auVar66._8_8_ < auVar68._8_8_);
                    auVar46 = blendvpd(auVar66,auVar63,auVar38);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar26) = auVar46;
                    auVar58 = blendvpd(auVar66,auVar68,auVar50);
                    plVar1 = (long *)((long)*ptr_02 + lVar26);
                    iVar45 = *plVar1;
                    lVar23 = plVar1[1];
                    lVar26 = lVar26 + 0x10;
                    lVar24 = lVar24 + uVar17 * 4;
                  } while (lVar16 != lVar26);
                  bVar8 = true;
                  do {
                    bVar22 = bVar8;
                    auVar59._0_8_ = auVar58._0_8_;
                    auVar59._8_4_ = auVar58._0_4_;
                    auVar59._12_4_ = auVar58._4_4_;
                    auVar58._8_8_ = auVar59._8_8_;
                    auVar58._0_8_ = ptr_01[uVar15 + 1] - uVar13;
                    lVar24 = 0;
                    lVar23 = lVar25;
                    do {
                      auVar46 = *(undefined1 (*) [16])((long)*ptr + lVar24);
                      auVar39._0_8_ = -(ulong)(auVar58._0_8_ < auVar46._0_8_);
                      lVar60 = auVar58._8_8_;
                      auVar39._8_8_ = -(ulong)(lVar60 < auVar46._8_8_);
                      auVar46 = blendvpd(auVar58,auVar46,auVar39);
                      *(undefined1 (*) [16])((long)*ptr + lVar24) = auVar46;
                      lVar61 = auVar46._0_8_;
                      lVar64 = auVar46._8_8_;
                      auVar40._0_8_ = -(ulong)(auVar49._0_8_ < lVar61);
                      auVar40._8_8_ = -(ulong)(auVar49._8_8_ < lVar64);
                      auVar49 = blendvpd(auVar46,auVar49,auVar40);
                      piVar5 = ((ppVar10->field_4).rowcols)->score_row;
                      *(int *)((long)piVar5 + lVar23) = auVar46._0_4_;
                      lVar26 = (long)piVar5 + lVar23;
                      uVar6 = extractps(auVar46,2);
                      *(undefined8 *)(lVar18 + lVar26) = uVar6;
                      auVar41._0_8_ = -(ulong)(lVar61 < auVar56._0_8_);
                      auVar41._8_8_ = -(ulong)(lVar64 < auVar56._8_8_);
                      auVar56 = blendvpd(auVar46,auVar56,auVar41);
                      auVar58._0_8_ = auVar58._0_8_ - (ulong)(uint)gap;
                      auVar58._8_8_ = lVar60 - (ulong)(uint)gap;
                      auVar42._0_8_ = -(ulong)((long)(lVar61 - uVar13) < auVar58._0_8_);
                      auVar42._8_8_ = -(ulong)((long)(lVar64 - uVar13) < auVar58._8_8_);
                      iVar28 = movmskpd((int)lVar26,auVar42);
                      if (iVar28 == 0) goto LAB_006c3c06;
                      lVar24 = lVar24 + 0x10;
                      lVar23 = lVar23 + uVar17 * 4;
                    } while (lVar16 != lVar24);
                    bVar8 = false;
                  } while (bVar22);
LAB_006c3c06:
                  uVar15 = uVar15 + 1;
                  lVar25 = lVar25 + 4;
                  palVar11 = ptr_02;
                  if (uVar15 == uVar17) {
                    alVar43 = ptr[(ulong)uVar9 % size];
                    auVar30 = alVar43._0_12_;
                    if (iVar27 < 1) {
                      do {
                        auVar7._8_8_ = 0;
                        auVar7._0_8_ = alVar43[0];
                        alVar43 = (__m128i)(auVar7 << 0x40);
                        auVar30 = alVar43._0_12_;
                      } while (iVar27 < 0);
                    }
                    auVar51._8_4_ = (int)uVar29;
                    auVar51._0_8_ = uVar29;
                    auVar51._12_4_ = (int)(uVar29 >> 0x20);
                    auVar55._0_8_ = -(ulong)((long)uVar29 < auVar49._0_8_);
                    auVar55._8_8_ = -(ulong)(auVar51._8_8_ < auVar49._8_8_);
                    auVar52._8_4_ = 0xffffffff;
                    auVar52._0_8_ = 0xffffffffffffffff;
                    auVar52._12_4_ = 0xffffffff;
                    auVar53._8_4_ = (int)lVar19;
                    auVar53._0_8_ = lVar19;
                    auVar53._12_4_ = uVar54;
                    auVar57._0_8_ = -(ulong)(lVar19 < auVar56._0_8_);
                    auVar57._8_8_ = -(ulong)(auVar53._8_8_ < auVar56._8_8_);
                    iVar28 = movmskpd(iVar27,auVar57 | auVar52 ^ auVar55);
                    if (iVar28 == 0) {
                      iVar28 = auVar30._8_4_;
                    }
                    else {
                      *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                      iVar28 = 0;
                      iVar12 = 0;
                      uVar9 = 0;
                    }
                    ppVar10->score = iVar28;
                    ppVar10->end_query = uVar9;
                    ppVar10->end_ref = iVar12;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr);
                    return ppVar10;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}